

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::anon_unknown_0::
CommandLineInterfaceTest_MultipleInputs_DescriptorSetIn_Test::TestBody
          (CommandLineInterfaceTest_MultipleInputs_DescriptorSetIn_Test *this)

{
  RepeatedPtrField<google::protobuf::FileDescriptorProto> *this_00;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::FileDescriptorProto>_>
  *pVVar1;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>_> *pVVar2;
  Arena *pAVar3;
  string_view filename;
  allocator<char> local_104;
  allocator<char> local_103;
  allocator<char> local_102;
  allocator<char> local_101;
  string local_100;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  FileDescriptorSet file_descriptor_set;
  
  FileDescriptorSet::FileDescriptorSet(&file_descriptor_set);
  this_00 = &file_descriptor_set.field_0._impl_.file_;
  pVVar1 = protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::internal::GenericTypeHandler<google::protobuf::FileDescriptorProto>>
                     (&this_00->super_RepeatedPtrFieldBase);
  *(byte *)&pVVar1->field_0 = *(byte *)&pVVar1->field_0 | 1;
  pAVar3 = (Arena *)(pVVar1->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar3 & 1) != 0) {
    pAVar3 = *(Arena **)((ulong)pAVar3 & 0xfffffffffffffffe);
  }
  protobuf::internal::ArenaStringPtr::Set(&(pVVar1->field_0)._impl_.name_,"foo.proto",pAVar3);
  pVVar2 = protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
                     (&(pVVar1->field_0)._impl_.message_type_.super_RepeatedPtrFieldBase);
  *(byte *)&pVVar2->field_0 = *(byte *)&pVVar2->field_0 | 1;
  pAVar3 = (Arena *)(pVVar2->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar3 & 1) != 0) {
    pAVar3 = *(Arena **)((ulong)pAVar3 & 0xfffffffffffffffe);
  }
  protobuf::internal::ArenaStringPtr::Set(&(pVVar2->field_0)._impl_.name_,"Foo",pAVar3);
  pVVar1 = protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::internal::GenericTypeHandler<google::protobuf::FileDescriptorProto>>
                     (&this_00->super_RepeatedPtrFieldBase);
  *(byte *)&pVVar1->field_0 = *(byte *)&pVVar1->field_0 | 1;
  pAVar3 = (Arena *)(pVVar1->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar3 & 1) != 0) {
    pAVar3 = *(Arena **)((ulong)pAVar3 & 0xfffffffffffffffe);
  }
  protobuf::internal::ArenaStringPtr::Set(&(pVVar1->field_0)._impl_.name_,"bar.proto",pAVar3);
  pVVar2 = protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
                     (&(pVVar1->field_0)._impl_.message_type_.super_RepeatedPtrFieldBase);
  *(byte *)&pVVar2->field_0 = *(byte *)&pVVar2->field_0 | 1;
  pAVar3 = (Arena *)(pVVar2->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar3 & 1) != 0) {
    pAVar3 = *(Arena **)((ulong)pAVar3 & 0xfffffffffffffffe);
  }
  protobuf::internal::ArenaStringPtr::Set(&(pVVar2->field_0)._impl_.name_,"Bar",pAVar3);
  filename._M_str = "foo.bin";
  filename._M_len = 7;
  CommandLineInterfaceTest::WriteDescriptorSet
            (&this->super_CommandLineInterfaceTest,filename,&file_descriptor_set);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,
             "protocol_compiler --test_out=$tmpdir --plug_out=$tmpdir --descriptor_set_in=$tmpdir/foo.bin foo.proto bar.proto"
             ,(allocator<char> *)&local_100);
  CommandLineInterfaceTest::Run(&this->super_CommandLineInterfaceTest,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  CommandLineInterfaceTester::ExpectNoErrors((CommandLineInterfaceTester *)this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_100,"test_generator",&local_101);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"foo.proto,bar.proto",&local_102);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"foo.proto",&local_103);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"Foo",&local_104);
  CommandLineInterfaceTest::ExpectGeneratedWithMultipleInputs
            (&this->super_CommandLineInterfaceTest,&local_100,&local_a0,&local_c0,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_100,"test_generator",&local_101);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"foo.proto,bar.proto",&local_102);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"bar.proto",&local_103);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"Bar",&local_104);
  CommandLineInterfaceTest::ExpectGeneratedWithMultipleInputs
            (&this->super_CommandLineInterfaceTest,&local_100,&local_a0,&local_c0,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_100,"test_plugin",&local_101);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"foo.proto,bar.proto",&local_102);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"foo.proto",&local_103);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"Foo",&local_104);
  CommandLineInterfaceTest::ExpectGeneratedWithMultipleInputs
            (&this->super_CommandLineInterfaceTest,&local_100,&local_a0,&local_c0,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_100,"test_plugin",&local_101);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"foo.proto,bar.proto",&local_102);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"bar.proto",&local_103);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"Bar",&local_104);
  CommandLineInterfaceTest::ExpectGeneratedWithMultipleInputs
            (&this->super_CommandLineInterfaceTest,&local_100,&local_a0,&local_c0,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_100);
  FileDescriptorSet::~FileDescriptorSet(&file_descriptor_set);
  return;
}

Assistant:

TEST_F(CommandLineInterfaceTest, MultipleInputs_DescriptorSetIn) {
  // Test parsing multiple input files.
  FileDescriptorSet file_descriptor_set;

  FileDescriptorProto* file_descriptor_proto = file_descriptor_set.add_file();
  file_descriptor_proto->set_name("foo.proto");
  file_descriptor_proto->add_message_type()->set_name("Foo");

  file_descriptor_proto = file_descriptor_set.add_file();
  file_descriptor_proto->set_name("bar.proto");
  file_descriptor_proto->add_message_type()->set_name("Bar");

  WriteDescriptorSet("foo.bin", &file_descriptor_set);

  Run("protocol_compiler --test_out=$tmpdir --plug_out=$tmpdir "
      "--descriptor_set_in=$tmpdir/foo.bin foo.proto bar.proto");

  ExpectNoErrors();
  ExpectGeneratedWithMultipleInputs("test_generator", "foo.proto,bar.proto",
                                    "foo.proto", "Foo");
  ExpectGeneratedWithMultipleInputs("test_generator", "foo.proto,bar.proto",
                                    "bar.proto", "Bar");
  ExpectGeneratedWithMultipleInputs("test_plugin", "foo.proto,bar.proto",
                                    "foo.proto", "Foo");
  ExpectGeneratedWithMultipleInputs("test_plugin", "foo.proto,bar.proto",
                                    "bar.proto", "Bar");
}